

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_300262::ArgParser::argEncrypt(ArgParser *this)

{
  element_type *__block;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  __shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2> local_40;
  string local_30 [32];
  
  __block = (this->c_main).super___shared_ptr<QPDFJob::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"",&local_61);
  std::__cxx11::string::string<std::allocator<char>>(local_30,"",&local_62);
  QPDFJob::Config::encrypt((Config *)&local_40,(char *)__block,0);
  std::__shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->c_enc).super___shared_ptr<QPDFJob::EncConfig,_(__gnu_cxx::_Lock_policy)2>,
             &local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&local_60);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->accumulated_args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"encryption",(allocator<char> *)local_30);
  QPDFArgParser::selectOptionTable(&this->ap,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void
ArgParser::argEncrypt()
{
    this->c_enc = c_main->encrypt(0, "", "");
    this->accumulated_args.clear();
    this->ap.selectOptionTable(O_ENCRYPTION);
}